

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O2

bool __thiscall
base::internal::HookList<void_(*)(const_void_*)>::Remove
          (HookList<void_(*)(const_void_*)> *this,_func_void_void_ptr *value)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  SpinLockHolder local_20;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr *)0x0) {
    bVar3 = false;
  }
  else {
    local_20.lock_ = (SpinLock *)&hooklist_spinlock;
    SpinLock::Lock((SpinLock *)&hooklist_spinlock);
    uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (this->priv_data[uVar2] == value) {
        if (uVar1 != uVar2) {
          this->priv_data[uVar2 & 0xffffffff] = (_func_void_void_ptr *)0x0;
          FixupPrivEndLocked(this);
          bVar3 = true;
          goto LAB_0011cda7;
        }
        break;
      }
    }
    bVar3 = false;
LAB_0011cda7:
    SpinLockHolder::~SpinLockHolder(&local_20);
  }
  return bVar3;
}

Assistant:

bool HookList<T>::Remove(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  int index = 0;
  while (index < hooks_end
         && value != cast_priv_data(index)->load(std::memory_order_relaxed)) {
    ++index;
  }
  if (index == hooks_end) {
    return false;
  }
  cast_priv_data(index)->store(T{}, std::memory_order_relaxed);
  FixupPrivEndLocked();
  return true;
}